

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1_gen.cc
# Opt level: O2

CBS_ASN1_TAG parse_tag(CBS *cbs)

{
  int iVar1;
  int reason;
  uint uVar2;
  uint8_t c;
  uint64_t num;
  CBS copy;
  
  copy.data = cbs->data;
  copy.len = cbs->len;
  iVar1 = CBS_get_u64_decimal(&copy,&num);
  if ((iVar1 == 0) || (0x1fffffff < num)) {
    iVar1 = 0x5b;
  }
  else {
    iVar1 = CBS_get_u8(&copy,&c);
    if (iVar1 != 0) {
      if (c == 'U') {
        uVar2 = 0;
LAB_0022ad79:
        if (copy.len == 0) goto LAB_0022ad91;
        iVar1 = 0x76;
      }
      else {
        if (c == 'C') {
          uVar2 = 0x80000000;
          goto LAB_0022ad79;
        }
        if (c == 'P') {
          uVar2 = 0xc0000000;
          goto LAB_0022ad79;
        }
        if (c == 'A') {
          uVar2 = 0x40000000;
          goto LAB_0022ad79;
        }
        iVar1 = 0x71;
      }
      reason = 0x90;
      goto LAB_0022addc;
    }
    uVar2 = 0x80000000;
LAB_0022ad91:
    if (num != 0 || uVar2 != 0) {
      return uVar2 | (uint)num;
    }
    iVar1 = 0x7e;
  }
  reason = 0x91;
LAB_0022addc:
  ERR_put_error(0xc,0,reason,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/asn1_gen.cc"
                ,iVar1);
  return 0;
}

Assistant:

static CBS_ASN1_TAG parse_tag(const CBS *cbs) {
  CBS copy = *cbs;
  uint64_t num;
  if (!CBS_get_u64_decimal(&copy, &num) || num > CBS_ASN1_TAG_NUMBER_MASK) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_INVALID_NUMBER);
    return 0;
  }

  CBS_ASN1_TAG tag_class = CBS_ASN1_CONTEXT_SPECIFIC;
  // The tag may be suffixed by a class.
  uint8_t c;
  if (CBS_get_u8(&copy, &c)) {
    switch (c) {
      case 'U':
        tag_class = CBS_ASN1_UNIVERSAL;
        break;
      case 'A':
        tag_class = CBS_ASN1_APPLICATION;
        break;
      case 'P':
        tag_class = CBS_ASN1_PRIVATE;
        break;
      case 'C':
        tag_class = CBS_ASN1_CONTEXT_SPECIFIC;
        break;
      default: {
        OPENSSL_PUT_ERROR(ASN1, ASN1_R_INVALID_MODIFIER);
        return 0;
      }
    }
    if (CBS_len(&copy) != 0) {
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_INVALID_MODIFIER);
      return 0;
    }
  }

  // Tag [UNIVERSAL 0] is reserved for indefinite-length end-of-contents. We
  // also use zero in this file to indicator no explicit tagging.
  if (tag_class == CBS_ASN1_UNIVERSAL && num == 0) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_INVALID_NUMBER);
    return 0;
  }

  return tag_class | (CBS_ASN1_TAG)num;
}